

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O2

bool is_dataset_locked(unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
                       *tasks,string_view dataset_id)

{
  bool bVar1;
  __node_base *p_Var2;
  DatasetLock DStack_78;
  _Variant_storage<false,_DatasetLock,_IteratorLock> local_58;
  
  p_Var2 = &(tasks->_M_h)._M_before_begin;
  do {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) break;
    DatasetLock::DatasetLock(&DStack_78,dataset_id);
    std::variant<DatasetLock,IteratorLock>::variant<DatasetLock,void,void,DatasetLock,void>
              ((variant<DatasetLock,IteratorLock> *)&local_58,&DStack_78);
    bVar1 = TaskSpec::has_lock((TaskSpec *)(p_Var2 + 2),(DatabaseLock *)&local_58);
    std::__detail::__variant::_Variant_storage<false,_DatasetLock,_IteratorLock>::~_Variant_storage
              (&local_58);
    std::__cxx11::string::~string((string *)&DStack_78);
  } while (!bVar1);
  return p_Var2 != (__node_base *)0x0;
}

Assistant:

bool is_dataset_locked(const std::unordered_map<uint64_t, TaskSpec> &tasks,
                       std::string_view dataset_id) {
    for (const auto &[k, task] : tasks) {
        if (task.has_lock(DatasetLock(dataset_id))) {
            return true;
        }
    }
    return false;
}